

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib1592.c
# Opt level: O3

int test(char *URL)

{
  int iVar1;
  int iVar2;
  undefined8 in_RAX;
  undefined8 uVar3;
  long lVar4;
  long lVar5;
  long lVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  char *pcVar9;
  timeval newer;
  int stillRunning;
  int local_34;
  
  local_34 = (int)((ulong)in_RAX >> 0x20);
  iVar1 = curl_global_init(3);
  uVar8 = _stderr;
  if (iVar1 != 0) {
    uVar3 = curl_easy_strerror(iVar1);
    curl_mfprintf(uVar8,"%s:%d curl_global_init() failed, with code %d (%s)\n",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/komeilkma[P]curl/tests/libtest/lib1592.c"
                  ,0x31,iVar1,uVar3);
    goto LAB_001024de;
  }
  lVar4 = curl_multi_init();
  if (lVar4 == 0) {
    lVar5 = 0;
    curl_mfprintf(_stderr,"%s:%d curl_multi_init() failed\n",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/komeilkma[P]curl/tests/libtest/lib1592.c"
                  ,0x33);
    iVar1 = 0x7b;
  }
  else {
    lVar5 = curl_easy_init();
    if (lVar5 == 0) {
      lVar5 = 0;
      curl_mfprintf(_stderr,"%s:%d curl_easy_init() failed\n",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/komeilkma[P]curl/tests/libtest/lib1592.c"
                    ,0x35);
      iVar1 = 0x7c;
    }
    else {
      iVar1 = curl_easy_setopt(lVar5,0x29,1);
      uVar8 = _stderr;
      if (iVar1 == 0) {
        iVar1 = curl_easy_setopt(lVar5,0x2712,URL);
        uVar8 = _stderr;
        if (iVar1 == 0) {
          iVar1 = curl_easy_setopt(lVar5,0x27e3,"0.0.0.0");
          if (iVar1 == 0) {
            uVar8 = 4000;
          }
          else {
            curl_mfprintf(_stderr,
                          "CURLOPT_DNS_SERVERS not supported; assuming curl_multi_remove_handle() will block\n"
                         );
            uVar8 = 1000;
          }
          iVar1 = curl_easy_setopt(lVar5,0x9b,uVar8);
          uVar8 = _stderr;
          if (iVar1 == 0) {
            iVar1 = curl_multi_add_handle(lVar4,lVar5);
            uVar8 = _stderr;
            if (iVar1 == 0) {
              curl_mfprintf(_stderr,"curl_multi_perform()...\n");
              iVar1 = curl_multi_perform(lVar4,&local_34);
              uVar8 = _stderr;
              if (iVar1 == 0) {
                if (local_34 < 0) {
                  curl_mfprintf(_stderr,
                                "%s:%d curl_multi_perform() succeeded, but returned invalid running_handles value (%d)\n"
                                ,
                                "/workspace/llm4binary/github/license_all_cmakelists_25/komeilkma[P]curl/tests/libtest/lib1592.c"
                                ,0x5e);
                  iVar1 = 0x7a;
                }
                else {
                  iVar1 = 0;
                  curl_mfprintf(_stderr,"curl_multi_perform() succeeded\n");
                  curl_mfprintf(_stderr,"curl_multi_remove_handle()...\n");
                  tv_test_start = tutil_tvnow();
                  iVar2 = curl_multi_remove_handle(lVar4,lVar5);
                  if (iVar2 == 0) {
                    curl_mfprintf(_stderr,"curl_multi_remove_handle() succeeded\n");
                    newer = tutil_tvnow();
                    lVar6 = tutil_tvdiff(newer,tv_test_start);
                    if (2000 < lVar6) {
                      curl_mfprintf(_stderr,
                                    "%s:%d ABORTING TEST, since it seems that it would have run forever.\n"
                                    ,
                                    "/workspace/llm4binary/github/license_all_cmakelists_25/komeilkma[P]curl/tests/libtest/lib1592.c"
                                    ,0x6f);
                      iVar1 = 0x7d;
                    }
                  }
                  else {
                    curl_mfprintf(_stderr,"curl_multi_remove_handle() failed, with code %d\n",iVar2)
                    ;
                    iVar1 = iVar2;
                  }
                }
                goto LAB_001024c9;
              }
              uVar3 = curl_multi_strerror(iVar1);
              pcVar9 = "%s:%d curl_multi_perform() failed, with code %d (%s)\n";
              uVar7 = 0x5e;
            }
            else {
              uVar3 = curl_multi_strerror(iVar1);
              pcVar9 = "%s:%d curl_multi_add_handle() failed, with code %d (%s)\n";
              uVar7 = 0x5a;
            }
          }
          else {
            uVar3 = curl_easy_strerror(iVar1);
            pcVar9 = "%s:%d curl_easy_setopt() failed, with code %d (%s)\n";
            uVar7 = 0x58;
          }
        }
        else {
          uVar3 = curl_easy_strerror(iVar1);
          pcVar9 = "%s:%d curl_easy_setopt() failed, with code %d (%s)\n";
          uVar7 = 0x38;
        }
      }
      else {
        uVar3 = curl_easy_strerror(iVar1);
        pcVar9 = "%s:%d curl_easy_setopt() failed, with code %d (%s)\n";
        uVar7 = 0x37;
      }
      curl_mfprintf(uVar8,pcVar9,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/komeilkma[P]curl/tests/libtest/lib1592.c"
                    ,uVar7,iVar1,uVar3);
    }
  }
LAB_001024c9:
  curl_easy_cleanup(lVar5);
  curl_multi_cleanup(lVar4);
  curl_global_cleanup();
LAB_001024de:
  return iVar1;
}

Assistant:

int test(char *URL)
{
  int stillRunning;
  CURLM *multiHandle = NULL;
  CURL *curl = NULL;
  CURLMcode res = CURLM_OK;
  int timeout;

  global_init(CURL_GLOBAL_ALL);

  multi_init(multiHandle);

  easy_init(curl);

  easy_setopt(curl, CURLOPT_VERBOSE, 1L);
  easy_setopt(curl, CURLOPT_URL, URL);

  /* Set a DNS server that hopefully will not respond when using c-ares. */
  if(curl_easy_setopt(curl, CURLOPT_DNS_SERVERS, "0.0.0.0") == CURLE_OK)
    /* Since we could set the DNS server, presume we are working with a
       resolver that can be cancelled (i.e. c-ares).  Thus,
       curl_multi_remove_handle() should not block even when the resolver
       request is outstanding.  So, set a request timeout _longer_ than the
       test hang timeout so we will fail if the handle removal call incorrectly
       blocks. */
    timeout = TEST_HANG_TIMEOUT * 2;
  else {
    /* If we can't set the DNS server, presume that we are configured to use a
       resolver that can't be cancelled (i.e. the threaded resolver or the
       non-threaded blocking resolver).  So, we just test that the
       curl_multi_remove_handle() call does finish well within our test
       timeout.

       But, it is very unlikely that the resolver request will take any time at
       all because we haven't been able to configure the resolver to use an
       non-responsive DNS server.  At least we exercise the flow.
       */
    fprintf(stderr,
            "CURLOPT_DNS_SERVERS not supported; "
            "assuming curl_multi_remove_handle() will block\n");
    timeout = TEST_HANG_TIMEOUT / 2;
  }

  /* Setting a timeout on the request should ensure that even if we have to
     wait for the resolver during curl_multi_remove_handle(), it won't take
     longer than this, because the resolver request inherits its timeout from
     this. */
  easy_setopt(curl, CURLOPT_TIMEOUT_MS, timeout);

  multi_add_handle(multiHandle, curl);

  /* This should move the handle from INIT => CONNECT => WAITRESOLVE. */
  fprintf(stderr, "curl_multi_perform()...\n");
  multi_perform(multiHandle, &stillRunning);
  fprintf(stderr, "curl_multi_perform() succeeded\n");

  /* Start measuring how long it takes to remove the handle. */
  fprintf(stderr, "curl_multi_remove_handle()...\n");
  start_test_timing();
  res = curl_multi_remove_handle(multiHandle, curl);
  if(res) {
    fprintf(stderr, "curl_multi_remove_handle() failed, "
            "with code %d\n", (int)res);
    goto test_cleanup;
  }
  fprintf(stderr, "curl_multi_remove_handle() succeeded\n");

  /* Fail the test if it took too long to remove.  This happens after the fact,
     and says "it seems that it would have run forever", which isn't true, but
     it's close enough, and simple to do. */
  abort_on_test_timeout();

test_cleanup:
  curl_easy_cleanup(curl);
  curl_multi_cleanup(multiHandle);
  curl_global_cleanup();

  return (int)res;
}